

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgcrypto.hpp
# Opt level: O0

string * ws::wx_decode_base64(string *__return_storage_ptr__,string *str_encrypt)

{
  bool bVar1;
  reference pcVar2;
  size_type sVar3;
  uchar *t;
  MsgCryptoError *pMVar4;
  uchar *f;
  allocator<char> local_b9;
  string local_b8;
  int local_98;
  undefined1 local_91;
  int rsize;
  allocator<char> local_81;
  string local_80;
  uchar *local_60;
  char *out;
  int osize;
  __unspec local_45 [13];
  undefined1 local_38 [16];
  undefined1 local_28 [8];
  const_reverse_iterator r;
  int eq;
  string *str_encrypt_local;
  string *ret;
  
  r.current._M_current._7_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  r.current._M_current._0_4_ = 0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::crbegin
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28);
  while( true ) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::crend
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
    local_38[0xf] =
         std::
         operator<=><__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ((reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_28,
                    (reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_38);
    std::__cmp_cat::__unspec::__unspec(local_45,(__unspec *)0x0);
    bVar1 = std::operator<(local_38[0xf]);
    if ((!bVar1) ||
       (pcVar2 = std::
                 reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_28), *pcVar2 != '=')) break;
    r.current._M_current._0_4_ = (int)r.current._M_current + 1;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&stack0xffffffffffffffb0,(int)local_28);
  }
  sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (str_encrypt);
  out._4_4_ = (int)sVar3;
  t = (uchar *)malloc((long)out._4_4_);
  local_60 = t;
  if (t != (uchar *)0x0) {
    local_98 = 0;
    f = (uchar *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 c_str(str_encrypt);
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      (str_encrypt);
    local_98 = EVP_DecodeBlock(t,f,(int)sVar3);
    if (((int)r.current._M_current < local_98) && (local_98 < out._4_4_)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                (__return_storage_ptr__,(char *)local_60,
                 (long)(local_98 - (int)r.current._M_current));
      free(local_60);
      return __return_storage_ptr__;
    }
    pMVar4 = (MsgCryptoError *)__cxa_allocate_exception(0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"EVP_DecodeBlock() error",&local_b9);
    MsgCryptoError::MsgCryptoError(pMVar4,&local_b8,(source_location)0x276eb8);
    __cxa_throw(pMVar4,&MsgCryptoError::typeinfo,MsgCryptoError::~MsgCryptoError);
  }
  local_91 = 1;
  pMVar4 = (MsgCryptoError *)__cxa_allocate_exception(0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"malloc error",&local_81);
  _rsize = &PTR_s__workspace_llm4binary_github_lic_00276ea0;
  MsgCryptoError::MsgCryptoError(pMVar4,&local_80,(source_location)0x276ea0);
  local_91 = 0;
  __cxa_throw(pMVar4,&MsgCryptoError::typeinfo,MsgCryptoError::~MsgCryptoError);
}

Assistant:

std::string wx_decode_base64(const std::string &str_encrypt)
  {
    std::string ret;
    int eq = 0;
    for (auto r = str_encrypt.crbegin(); r < str_encrypt.crend(); r++)
    {
      if (*r == '=')
      {
        eq++;
      }
      else
      {
        break;
      }
    }
    
    int osize = int(str_encrypt.size());
    char *out = (char *) malloc(osize);
    if (out == nullptr)
    {
      throw MsgCryptoError("malloc error");
    }
    
    int rsize = 0;
    rsize = EVP_DecodeBlock((unsigned char *) out, (const unsigned char *) str_encrypt.c_str(),
                            int(str_encrypt.size()));
    if (rsize > eq && rsize < osize)
    {
      ret.assign(out, rsize - eq);
    }
    else
    {
      throw MsgCryptoError("EVP_DecodeBlock() error");
    }
    
    free(out);
    out = nullptr;
    return ret;
  }